

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::ProgramSizeBigProgram(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  LogMessage local_738;
  LogMessage local_5b8;
  LogMessage local_438;
  undefined1 local_2b8 [8];
  RE2 re_complex;
  undefined1 local_1c8 [8];
  RE2 re_medium;
  RE2 re_simple;
  
  RE2::RE2((RE2 *)&re_medium.named_groups_once_,"simple regexp");
  RE2::RE2((RE2 *)local_1c8,"medium.*regexp");
  RE2::RE2((RE2 *)local_2b8,"complex.{1,128}regexp");
  iVar1 = RE2::ProgramSize((RE2 *)&re_medium.named_groups_once_);
  if (iVar1 < 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d4);
    poVar3 = LogMessage::stream(&local_438);
    std::operator<<(poVar3,"Check failed: (re_simple.ProgramSize()) > (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_438);
  }
  iVar1 = RE2::ProgramSize((RE2 *)local_1c8);
  iVar2 = RE2::ProgramSize((RE2 *)&re_medium.named_groups_once_);
  if (iVar1 <= iVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d5);
    poVar3 = LogMessage::stream(&local_5b8);
    std::operator<<(poVar3,"Check failed: (re_medium.ProgramSize()) > (re_simple.ProgramSize())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5b8);
  }
  iVar1 = RE2::ProgramSize((RE2 *)local_2b8);
  iVar2 = RE2::ProgramSize((RE2 *)local_1c8);
  if (iVar1 <= iVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_738,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d6);
    poVar3 = LogMessage::stream(&local_738);
    std::operator<<(poVar3,"Check failed: (re_complex.ProgramSize()) > (re_medium.ProgramSize())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_738);
  }
  RE2::~RE2((RE2 *)local_2b8);
  RE2::~RE2((RE2 *)local_1c8);
  RE2::~RE2((RE2 *)&re_medium.named_groups_once_);
  return;
}

Assistant:

TEST(ProgramSize, BigProgram) {
  RE2 re_simple("simple regexp");
  RE2 re_medium("medium.*regexp");
  RE2 re_complex("complex.{1,128}regexp");

  CHECK_GT(re_simple.ProgramSize(), 0);
  CHECK_GT(re_medium.ProgramSize(), re_simple.ProgramSize());
  CHECK_GT(re_complex.ProgramSize(), re_medium.ProgramSize());
}